

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O0

void GEN_CS::gen_cs_example_dr<false>(cb_to_cs_adf *c,multi_ex *examples,label *cs_labels)

{
  float fVar1;
  bool bVar2;
  size_type sVar3;
  wclass *pwVar4;
  v_array<COST_SENSITIVE::wclass> *in_RDX;
  example *in_RSI;
  cb_class *in_RDI;
  single_learner *unaff_retaddr;
  int known_index;
  wclass wc;
  size_t i;
  int startK;
  bool shared;
  wclass *in_stack_ffffffffffffff98;
  example *in_stack_ffffffffffffffa0;
  example *in_stack_ffffffffffffffb8;
  ulong uVar5;
  float local_38;
  int local_34;
  ulong local_28;
  uint local_20;
  byte local_19;
  
  v_array<COST_SENSITIVE::wclass>::clear
            ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffffa0);
  std::vector<example_*,_std::allocator<example_*>_>::operator[]
            ((vector<example_*,_std::allocator<example_*>_> *)in_RSI,0);
  local_19 = CB::ec_is_example_header(in_stack_ffffffffffffffb8);
  local_20 = (uint)local_19;
  v_array<COST_SENSITIVE::wclass>::clear
            ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffffa0);
  local_28 = 0;
  while (uVar5 = local_28,
        sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size
                          ((vector<example_*,_std::allocator<example_*>_> *)in_RSI), uVar5 < sVar3)
  {
    std::vector<example_*,_std::allocator<example_*>_>::operator[]
              ((vector<example_*,_std::allocator<example_*>_> *)in_RSI,local_28);
    bVar2 = CB_ALGS::example_is_newline_not_header(in_stack_ffffffffffffffa0);
    if (!bVar2) {
      memset(&local_38,0,0x10);
      if ((int)in_RDI[5].partial_prediction + local_20 == local_28) {
        fVar1 = in_RDI[5].partial_prediction;
        in_RDI[5].partial_prediction = 0.0;
        std::vector<example_*,_std::allocator<example_*>_>::operator[]
                  ((vector<example_*,_std::allocator<example_*>_> *)in_RSI,local_28);
        local_38 = CB_ALGS::get_cost_pred<false>
                             (unaff_retaddr,in_RDI,in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),
                              (uint32_t)in_RDX);
        in_RDI[5].partial_prediction = fVar1;
      }
      else {
        in_stack_ffffffffffffffa0 = *(example **)&in_RDI[6].probability;
        std::vector<example_*,_std::allocator<example_*>_>::operator[]
                  ((vector<example_*,_std::allocator<example_*>_> *)in_RSI,local_28);
        local_38 = CB_ALGS::get_cost_pred<false>
                             (unaff_retaddr,in_RDI,in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),
                              (uint32_t)in_RDX);
      }
      local_34 = (int)local_28;
      if ((local_19 & 1) != 0) {
        local_34 = local_34 + -1;
      }
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
      if (((in_RDI[6].cost != -1.0) || (NAN(in_RDI[6].cost))) &&
         ((int)in_RDI[5].partial_prediction + local_20 == local_28)) {
        local_38 = (in_RDI[5].probability - local_38) / in_RDI[6].cost + local_38;
      }
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
    }
    local_28 = local_28 + 1;
  }
  if ((local_19 & 1) != 0) {
    pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[](in_RDX,0);
    pwVar4->class_index = 0;
    pwVar4 = v_array<COST_SENSITIVE::wclass>::operator[](in_RDX,0);
    pwVar4->x = -3.4028235e+38;
  }
  return;
}

Assistant:

void gen_cs_example_dr(cb_to_cs_adf& c, multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{  // size_t mysize = examples.size();
  c.pred_scores.costs.clear();
  bool shared = CB::ec_is_example_header(*examples[0]);
  int startK = 0;
  if (shared)
    startK = 1;

  cs_labels.costs.clear();
  for (size_t i = 0; i < examples.size(); i++)
  {
    if (CB_ALGS::example_is_newline_not_header(*examples[i]))
      continue;

    COST_SENSITIVE::wclass wc = {0., 0, 0., 0.};

    if (c.known_cost.action + startK == i)
    {
      int known_index = c.known_cost.action;
      c.known_cost.action = 0;
      // get cost prediction for this label
      // num_actions should be 1 effectively.
      // my get_cost_pred function will use 1 for 'index-1+base'
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, &(c.known_cost), *(examples[i]), 0, 2);
      c.known_cost.action = known_index;
    }
    else
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, nullptr, *(examples[i]), 0, 2);

    if (shared)
      wc.class_index = (uint32_t)i - 1;
    else
      wc.class_index = (uint32_t)i;
    c.pred_scores.costs.push_back(wc);  // done

    // add correction if we observed cost for this action and regressor is wrong
    if (c.known_cost.probability != -1 && c.known_cost.action + startK == i)
      wc.x += (c.known_cost.cost - wc.x) / c.known_cost.probability;
    cs_labels.costs.push_back(wc);
  }

  if (shared)  // take care of shared examples
  {
    cs_labels.costs[0].class_index = 0;
    cs_labels.costs[0].x = -FLT_MAX;
  }
}